

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_register_loader(stbi_loader *loader)

{
  int local_1c;
  int i;
  stbi_loader *loader_local;
  
  local_1c = 0;
  while( true ) {
    if (0x1f < local_1c) {
      return 0;
    }
    if (loaders[local_1c] == loader) break;
    if (loaders[local_1c] == (stbi_loader *)0x0) {
      loaders[local_1c] = loader;
      max_loaders = local_1c + 1;
      return 1;
    }
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

int stbi_register_loader(stbi_loader *loader)
{
   int i;
   for (i=0; i < MAX_LOADERS; ++i) {
      // already present?
      if (loaders[i] == loader)
         return 1;
      // end of the list?
      if (loaders[i] == NULL) {
         loaders[i] = loader;
         max_loaders = i+1;
         return 1;
      }
   }
   // no room for it
   return 0;
}